

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O3

void __thiscall sc_core::sc_clock::report_error(sc_clock *this,char *id,char *add_msg)

{
  char *__s;
  size_t sVar1;
  stringstream msg;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  long local_198 [47];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (add_msg != (char *)0x0) {
    sVar1 = strlen(add_msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,add_msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"clock \'",7);
  __s = (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
        super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
        super_sc_prim_channel.super_sc_object.m_name._M_dataplus._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\'",1);
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_ERROR,id,local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/communication/sc_clock.cpp"
             ,0x124);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void
sc_clock::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if( add_msg != 0 )
      msg << add_msg << ": ";
    msg << "clock '" << name() << "'";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}